

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bheap.c
# Opt level: O1

void sx_bheap_push_max(sx_bheap *bh,int key,void *user)

{
  int iVar1;
  undefined4 uVar2;
  sx_bheap_item *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  code *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (bh->capacity <= bh->count) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/bheap.c",
                      0x79,"BinaryHeap\'s capacity exceeded");
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  uVar7 = (ulong)bh->count;
  psVar3 = bh->items;
  psVar3[uVar7].key = key;
  psVar3[uVar7].user = user;
  while (0 < (int)uVar7) {
    uVar8 = (ulong)((int)uVar7 - 1U >> 1);
    psVar3 = bh->items;
    uVar7 = uVar7 & 0xffffffff;
    iVar1 = psVar3[uVar7].key;
    uVar2 = *(undefined4 *)((long)&psVar3[uVar7].user + 4);
    uVar4 = *(undefined8 *)&psVar3[uVar7].field_0x4;
    if (iVar1 <= psVar3[uVar8].key) break;
    psVar3[uVar7].key = psVar3[uVar8].key;
    uVar5 = *(undefined8 *)&psVar3[uVar8].field_0x4;
    *(undefined4 *)((long)&psVar3[uVar7].user + 4) = *(undefined4 *)((long)&psVar3[uVar8].user + 4);
    *(undefined8 *)&psVar3[uVar7].field_0x4 = uVar5;
    psVar3 = bh->items;
    psVar3[uVar8].key = iVar1;
    *(undefined8 *)&psVar3[uVar8].field_0x4 = uVar4;
    *(undefined4 *)((long)&psVar3[uVar8].user + 4) = uVar2;
    uVar7 = uVar8;
  }
  bh->count = bh->count + 1;
  return;
}

Assistant:

void sx_bheap_push_max(sx_bheap* bh, int key, void* user)
{
    sx_assertf(bh->count < bh->capacity, "BinaryHeap's capacity exceeded");

    // Put the value at the bottom the tree and traverse up
    int index = bh->count;
    bh->items[index].key = key;
    bh->items[index].user = user;

    while (index > 0) {
        int parent_idx = (index - 1) >> 1;
        sx_bheap_item cur = bh->items[index];
        sx_bheap_item parent = bh->items[parent_idx];

        if (cur.key > parent.key) {
            bh->items[index] = parent;
            bh->items[parent_idx] = cur;
        } else {
            break;
        }

        index = parent_idx;
    }
    ++bh->count;
}